

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceMethod
          (Parser *this,MethodDescriptorProto *method,LocationRecorder *method_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  MethodOptions *mutable_options;
  Arena *pAVar4;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  text._M_str = "rpc";
  text._M_len = 3;
  bVar1 = Consume(this,text);
  if (bVar1) {
    LocationRecorder::Init(&LStack_48,method_location,method_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,1);
    LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,NAME);
    *(byte *)&method->field_0 = *(byte *)&method->field_0 | 1;
    pAVar4 = (Arena *)(method->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    psVar3 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&(method->field_0)._impl_.name_,pAVar4);
    bVar1 = ConsumeIdentifier(this,psVar3,(ErrorMaker)ZEXT816(0x3e9669));
    LocationRecorder::~LocationRecorder(&LStack_48);
    if ((bVar1) && (text_00._M_str = "(", text_00._M_len = 1, bVar1 = Consume(this,text_00), bVar1))
    {
      if (((this->input_->current_).text._M_string_length == 6) &&
         (iVar2 = bcmp((this->input_->current_).text._M_dataplus._M_p,"stream",6), iVar2 == 0)) {
        LocationRecorder::Init(&LStack_48,method_location,method_location->source_code_info_);
        RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,5);
        LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,OTHER);
        (method->field_0)._impl_.client_streaming_ = true;
        *(byte *)&method->field_0 = *(byte *)&method->field_0 | 0x10;
        text_01._M_str = "stream";
        text_01._M_len = 6;
        bVar1 = Consume(this,text_01);
        LocationRecorder::~LocationRecorder(&LStack_48);
        if (!bVar1) {
          return false;
        }
      }
      LocationRecorder::Init(&LStack_48,method_location,method_location->source_code_info_);
      RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,2);
      LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,INPUT_TYPE);
      *(byte *)&method->field_0 = *(byte *)&method->field_0 | 2;
      pAVar4 = (Arena *)(method->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      psVar3 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                         (&(method->field_0)._impl_.input_type_,pAVar4);
      bVar1 = ParseUserDefinedType(this,psVar3);
      LocationRecorder::~LocationRecorder(&LStack_48);
      if ((((bVar1) &&
           (text_02._M_str = ")", text_02._M_len = 1, bVar1 = Consume(this,text_02), bVar1)) &&
          (text_03._M_str = "returns", text_03._M_len = 7, bVar1 = Consume(this,text_03), bVar1)) &&
         (text_04._M_str = "(", text_04._M_len = 1, bVar1 = Consume(this,text_04), bVar1)) {
        if (((this->input_->current_).text._M_string_length == 6) &&
           (iVar2 = bcmp((this->input_->current_).text._M_dataplus._M_p,"stream",6), iVar2 == 0)) {
          LocationRecorder::LocationRecorder(&LStack_48,method_location,6);
          LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,OTHER);
          text_05._M_str = "stream";
          text_05._M_len = 6;
          bVar1 = Consume(this,text_05);
          if (!bVar1) {
            LocationRecorder::~LocationRecorder(&LStack_48);
            return false;
          }
          (method->field_0)._impl_.server_streaming_ = true;
          *(byte *)&method->field_0 = *(byte *)&method->field_0 | 0x20;
          LocationRecorder::~LocationRecorder(&LStack_48);
        }
        LocationRecorder::LocationRecorder(&LStack_48,method_location,3);
        LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,OUTPUT_TYPE);
        psVar3 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(method);
        bVar1 = ParseUserDefinedType(this,psVar3);
        LocationRecorder::~LocationRecorder(&LStack_48);
        if ((bVar1) &&
           (text_06._M_str = ")", text_06._M_len = 1, bVar1 = Consume(this,text_06), bVar1)) {
          if (((this->input_->current_).text._M_string_length == 1) &&
             (iVar2 = bcmp((this->input_->current_).text._M_dataplus._M_p,"{",1), iVar2 == 0)) {
            mutable_options = MethodDescriptorProto::mutable_options(method);
            bVar1 = ParseMethodOptions(this,method_location,containing_file,4,
                                       &mutable_options->super_Message);
          }
          else {
            text_07._M_str = ";";
            text_07._M_len = 1;
            bVar1 = ConsumeEndOfDeclaration(this,text_07,method_location);
          }
          if (bVar1 != false) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceMethod(MethodDescriptorProto* method,
                                const LocationRecorder& method_location,
                                const FileDescriptorProto* containing_file) {
  DO(Consume("rpc"));

  {
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(method, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(method->mutable_name(), "Expected method name."));
  }

  // Parse input type.
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kClientStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      method->set_client_streaming(true);
      DO(Consume("stream"));
    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kInputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::INPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_input_type()));
  }
  DO(Consume(")"));

  // Parse output type.
  DO(Consume("returns"));
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kServerStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      DO(Consume("stream"));
      method->set_server_streaming(true);
    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kOutputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::OUTPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_output_type()));
  }
  DO(Consume(")"));

  if (LookingAt("{")) {
    // Options!
    DO(ParseMethodOptions(method_location, containing_file,
                          MethodDescriptorProto::kOptionsFieldNumber,
                          method->mutable_options()));
  } else {
    DO(ConsumeEndOfDeclaration(";", &method_location));
  }

  return true;
}